

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

bool __thiscall
re2::Tester::TestCase(Tester *this,StringPiece *text,StringPiece *context,Anchor anchor)

{
  bool bVar1;
  size_type sVar2;
  reference ppTVar3;
  bool local_41;
  ulong local_30;
  size_t i;
  bool okay;
  Anchor anchor_local;
  StringPiece *context_local;
  StringPiece *text_local;
  Tester *this_local;
  
  i._3_1_ = true;
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>::size(&this->v_);
    if (sVar2 <= local_30) break;
    ppTVar3 = std::vector<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>::operator[]
                        (&this->v_,local_30);
    bVar1 = TestInstance::error(*ppTVar3);
    local_41 = false;
    if (!bVar1) {
      ppTVar3 = std::vector<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>::operator[]
                          (&this->v_,local_30);
      local_41 = TestInstance::RunCase(*ppTVar3,text,context,anchor);
    }
    i._3_1_ = (i._3_1_ & local_41) != 0;
    local_30 = local_30 + 1;
  }
  return i._3_1_;
}

Assistant:

bool Tester::TestCase(const StringPiece& text, const StringPiece& context,
                         Prog::Anchor anchor) {
  bool okay = true;
  for (size_t i = 0; i < v_.size(); i++)
    okay &= (!v_[i]->error() && v_[i]->RunCase(text, context, anchor));
  return okay;
}